

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void hotspot_cb(Fl_Light_Button *i,void *v)

{
  int iVar1;
  Fl_Type *pFVar2;
  char *a;
  Fl_Widget_Type *pFVar3;
  
  pFVar3 = current_widget;
  if ((char *)v == "LOAD") {
    if (1 < numselected) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    a = "divider";
    if (iVar1 == 0) {
      a = "hotspot";
    }
    Fl_Widget::label((Fl_Widget *)i,a);
    Fl_Widget::activate((Fl_Widget *)i);
    Fl_Button::value(&i->super_Fl_Button,(uint)current_widget->hotspot_);
    return;
  }
  current_widget->hotspot_ = (i->super_Fl_Button).value_;
  iVar1 = (*(pFVar3->super_Fl_Type)._vptr_Fl_Type[0x1e])();
  if (iVar1 != 0) {
    Fl_Widget_Type::redraw(current_widget);
    return;
  }
  if ((i->super_Fl_Button).value_ != '\0') {
    pFVar2 = (current_widget->super_Fl_Type).parent;
    if (pFVar2 != (Fl_Type *)0x0) {
      iVar1 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
      if (iVar1 != 0) {
        while( true ) {
          iVar1 = (*pFVar2->_vptr_Fl_Type[0x21])(pFVar2);
          if (iVar1 != 0) break;
          pFVar2 = pFVar2->parent;
        }
        for (pFVar3 = (Fl_Widget_Type *)pFVar2->next;
            (pFVar3 != (Fl_Widget_Type *)0x0 && (pFVar2->level < (pFVar3->super_Fl_Type).level));
            pFVar3 = (Fl_Widget_Type *)(pFVar3->super_Fl_Type).next) {
          iVar1 = (*(pFVar3->super_Fl_Type)._vptr_Fl_Type[0x17])(pFVar3);
          if ((iVar1 != 0) && (pFVar3 != current_widget)) {
            pFVar3->hotspot_ = '\0';
          }
        }
        goto LAB_0018497d;
      }
    }
    return;
  }
LAB_0018497d:
  set_modflag(1);
  return;
}

Assistant:

void hotspot_cb(Fl_Light_Button* i,void* v) {
  if (v == LOAD) {
    if (numselected > 1) {i->deactivate(); return;}
    if (current_widget->is_menu_item()) i->label("divider");
    else i->label("hotspot");
    i->activate();
    i->value(current_widget->hotspot());
  } else {
    current_widget->hotspot(i->value());
    if (current_widget->is_menu_item()) {current_widget->redraw(); return;}
    if (i->value()) {
      Fl_Type *p = current_widget->parent;
      if (!p || !p->is_widget()) return;
      while (!p->is_window()) p = p->parent;
      for (Fl_Type *o = p->next; o && o->level > p->level; o = o->next) {
	if (o->is_widget() && o != current_widget)
	  ((Fl_Widget_Type*)o)->hotspot(0);
      }
    }
    set_modflag(1);
  }
}